

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int is_nifti_file(char *hname)

{
  int iVar1;
  char *fname;
  size_t sVar2;
  int local_19c;
  char *tmpname;
  znzFile pzStack_180;
  int ii;
  znzFile fp;
  nifti_1_header nhdr;
  char *hname_local;
  
  nhdr._340_8_ = hname;
  iVar1 = nifti_validfilename(hname);
  if (iVar1 == 0) {
    hname_local._4_4_ = -1;
  }
  else {
    fname = nifti_findhdrname((char *)nhdr._340_8_);
    if (fname == (char *)0x0) {
      if (0 < g_opts.debug) {
        fprintf(_stderr,"** no header file found for \'%s\'\n",nhdr._340_8_);
      }
      hname_local._4_4_ = -1;
    }
    else {
      iVar1 = nifti_is_gzfile(fname);
      pzStack_180 = znzopen(fname,"rb",iVar1);
      free(fname);
      if (pzStack_180 == (znzFile)0x0) {
        hname_local._4_4_ = -1;
      }
      else {
        sVar2 = znzread((void *)((long)&fp + 4),1,0x15c,pzStack_180);
        tmpname._4_4_ = (int)sVar2;
        Xznzclose(&stack0xfffffffffffffe80);
        if (tmpname._4_4_ < 0x15c) {
          hname_local._4_4_ = -1;
        }
        else {
          if ((((nhdr.intent_name[8] == 'n') && (nhdr.intent_name[0xb] == '\0')) &&
              ((nhdr.intent_name[9] == 'i' || (nhdr.intent_name[9] == '+')))) &&
             (('0' < nhdr.intent_name[10] && (nhdr.intent_name[10] < ':')))) {
            local_19c = nhdr.intent_name[10] + -0x30;
          }
          else {
            local_19c = 0;
          }
          if (local_19c == 0) {
            tmpname._4_4_ = fp._4_4_;
            if (fp._4_4_ == 0x15c) {
              hname_local._4_4_ = 0;
            }
            else {
              nifti_swap_4bytes(1,(void *)((long)&tmpname + 4));
              if (tmpname._4_4_ == 0x15c) {
                hname_local._4_4_ = 0;
              }
              else {
                hname_local._4_4_ = -1;
              }
            }
          }
          else {
            hname_local._4_4_ = 2;
            if (nhdr.intent_name[9] == '+') {
              hname_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  return hname_local._4_4_;
}

Assistant:

int is_nifti_file( const char *hname )
{
   struct nifti_1_header nhdr ;
   znzFile fp ;
   int ii ;
   char *tmpname;

   /* bad input name? */

   if( !nifti_validfilename(hname) ) return -1 ;

   /* open file */

   tmpname = nifti_findhdrname(hname);
   if( tmpname == NULL ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** no header file found for '%s'\n",hname);
      return -1;
   }
   fp = znzopen( tmpname , "rb" , nifti_is_gzfile(tmpname) ) ;
   free(tmpname);
   if (znz_isnull(fp))                      return -1 ;  /* bad open? */

   /* read header, close file */

   ii = (int)znzread( &nhdr , 1 , sizeof(nhdr) , fp ) ;
   znzclose( fp ) ;
   if( ii < (int) sizeof(nhdr) )               return -1 ;  /* bad read? */

   /* check for NIFTI-ness */

   if( NIFTI_VERSION(nhdr) != 0 ){
     return ( NIFTI_ONEFILE(nhdr) ) ? 1 : 2 ;
   }

   /* check for ANALYZE-ness (sizeof_hdr field == 348) */

   ii = nhdr.sizeof_hdr ;
   if( ii == (int)sizeof(nhdr) ) return 0 ;  /* matches */

   /* try byte-swapping header */

   swap_4(ii) ;
   if( ii == (int)sizeof(nhdr) ) return 0 ;  /* matches */

   return -1 ;                          /* not good */
}